

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool ppk_save_f(Filename *filename,ssh2_userkey *key,char *passphrase,ppk_save_parameters *params)

{
  size_t sVar1;
  int iVar2;
  FILE *__s;
  strbuf *buf_o;
  size_t sVar3;
  _Bool _Var4;
  
  __s = (FILE *)f_open(filename,"wb",true);
  if (__s == (FILE *)0x0) {
    _Var4 = false;
  }
  else {
    buf_o = ppk_save_sb(key,passphrase,params);
    sVar3 = fwrite(buf_o->s,1,buf_o->len,__s);
    sVar1 = buf_o->len;
    iVar2 = fclose(__s);
    _Var4 = iVar2 == 0 && sVar3 == sVar1;
    strbuf_free(buf_o);
  }
  return _Var4;
}

Assistant:

bool ppk_save_f(const Filename *filename, ssh2_userkey *key,
                const char *passphrase, const ppk_save_parameters *params)
{
    FILE *fp = f_open(filename, "wb", true);
    if (!fp)
        return false;

    strbuf *buf = ppk_save_sb(key, passphrase, params);
    bool toret = fwrite(buf->s, 1, buf->len, fp) == buf->len;
    if (fclose(fp))
        toret = false;
    strbuf_free(buf);
    return toret;
}